

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1,float_const&,float_const&>
                (float *args_,float *args__1)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  handle *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  PyObject **ppPVar5;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range2;
  int counter;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  argtypes;
  size_t i;
  array<pybind11::object,_2UL> args;
  size_t size;
  tuple *result;
  handle in_stack_fffffffffffffe38;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_fffffffffffffe40;
  PyTypeObject *pPVar6;
  handle in_stack_fffffffffffffe48;
  array<pybind11::object,_2UL> *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  tuple *in_stack_fffffffffffffe60;
  char *__lhs;
  handle local_128;
  iterator local_120;
  iterator local_118;
  iterator local_110;
  array<pybind11::object,_2UL> *local_108;
  int local_100;
  undefined1 local_fa;
  undefined1 local_f9;
  char *local_b8;
  char local_b0 [64];
  ulong local_70;
  handle local_68;
  PyObject *local_60;
  handle local_48;
  PyObject *local_40;
  object *local_38;
  array<pybind11::object,_2UL> local_30;
  undefined8 local_20;
  
  local_20 = 2;
  local_38 = local_30._M_elems;
  handle::handle(&local_48,(PyObject *)0x0);
  local_40 = (PyObject *)
             detail::type_caster<float,_void>::cast<float>(0.0,automatic,in_stack_fffffffffffffe38);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe48);
  local_38 = local_30._M_elems + 1;
  handle::handle(&local_68,(PyObject *)0x0);
  local_60 = (PyObject *)
             detail::type_caster<float,_void>::cast<float>(0.0,automatic,in_stack_fffffffffffffe38);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe48);
  local_70 = 0;
  while( true ) {
    uVar1 = local_70;
    sVar4 = std::array<pybind11::object,_2UL>::size(&local_30);
    if (sVar4 <= uVar1) {
      local_fa = 0;
      tuple::tuple(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_100 = 0;
      local_108 = &local_30;
      local_110 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)0x1a65c3)
      ;
      local_118 = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)0x1a65d8);
      while( true ) {
        if (local_110 == local_118) {
          local_fa = 1;
          std::array<pybind11::object,_2UL>::~array(in_stack_fffffffffffffe50);
          return (tuple)in_RDI.super_handle.m_ptr;
        }
        local_120 = local_110;
        local_128 = object::release(in_stack_fffffffffffffe38.m_ptr);
        ppPVar5 = handle::ptr(&local_128);
        pPVar6 = (PyTypeObject *)*ppPVar5;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        iVar3 = PyType_HasFeature((*ppPVar5)->ob_type,0x4000000);
        if (iVar3 == 0) break;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar5)[1].ob_type)[local_100] = pPVar6;
        local_110 = local_110 + 1;
        local_100 = local_100 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/cast.h"
                    ,0x3d9,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const float &, const float &>]"
                   );
    }
    this = &std::array<pybind11::object,_2UL>::operator[]
                      ((array<pybind11::object,_2UL> *)in_stack_fffffffffffffe40,
                       (size_type)in_stack_fffffffffffffe38.m_ptr)->super_handle;
    bVar2 = handle::operator_cast_to_bool(this);
    if (!bVar2) break;
    local_70 = local_70 + 1;
  }
  __lhs = local_b0;
  local_b8 = __lhs;
  type_id<float_const&>();
  local_b8 = __lhs + 0x20;
  type_id<float_const&>();
  local_f9 = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  operator[](in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38.m_ptr);
  std::operator+(__lhs,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48.m_ptr,(char *)in_stack_fffffffffffffe40);
  cast_error::runtime_error
            ((cast_error *)in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38.m_ptr);
  local_f9 = 0;
  __cxa_throw(__rhs,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}